

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O0

void __thiscall
Potassco::AspifOutput::theoryAtom
          (AspifOutput *this,Id_t atomOrZero,Id_t termId,IdSpan *elements,Id_t op,Id_t rhs)

{
  AtomSpan *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  AspifOutput *in_RDI;
  Directive_t in_R8D;
  int in_stack_ffffffffffffffcc;
  AspifOutput *in_stack_ffffffffffffffd8;
  
  Directive_t::Directive_t((Directive_t *)&stack0xffffffffffffffdc,Theory);
  startDir(in_stack_ffffffffffffffd8,in_R8D);
  add(in_RDI,in_stack_ffffffffffffffcc);
  add(in_RDI,in_stack_ffffffffffffffcc);
  add(in_RDI,in_stack_ffffffffffffffcc);
  add((AspifOutput *)CONCAT44(in_ESI,in_EDX),in_RCX);
  add(in_RDI,in_stack_ffffffffffffffcc);
  add(in_RDI,in_stack_ffffffffffffffcc);
  endDir(in_RDI);
  return;
}

Assistant:

void AspifOutput::theoryAtom(Id_t atomOrZero, Id_t termId, const IdSpan& elements, Id_t op, Id_t rhs) {
	startDir(Directive_t::Theory).add(Theory_t::AtomWithGuard).add(atomOrZero).add(termId).add(elements).add(op).add(rhs).endDir();
}